

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

bool __thiscall mjs::interpreter::impl::scope::has_property(scope *this,wstring *id)

{
  bool bVar1;
  bool bVar2;
  object *this_00;
  scope *this_01;
  wstring_view local_20;
  
  if ((this->activation_).pos_ != 0) {
    this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->activation_,this->heap_);
    local_20._M_str = (id->_M_dataplus)._M_p;
    local_20._M_len = id->_M_string_length;
    bVar1 = object::has_property(this_00,&local_20);
    bVar2 = true;
    if (!bVar1) {
      if ((this->prev_).pos_ == 0) {
        bVar2 = false;
      }
      else {
        this_01 = gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::dereference
                            (&this->prev_,this->heap_);
        bVar2 = has_property(this_01,id);
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

explicit operator bool() const { return pos_; }